

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::WriteSegmentHeader(Segment *this)

{
  bool bVar1;
  undefined4 uVar2;
  int32 iVar3;
  int32 iVar4;
  int iVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  uint64_t uVar8;
  IMkvWriter *in_RDI;
  IMkvWriter *unaff_retaddr;
  Tags *in_stack_00000008;
  char *doc_type;
  Segment *in_stack_00000078;
  char *in_stack_ffffffffffffffb8;
  SeekHead *in_stack_ffffffffffffffc0;
  IMkvWriter *in_stack_ffffffffffffffc8;
  SeekHead *this_00;
  Segment *in_stack_ffffffffffffffd0;
  SeekHead *this_01;
  SeekHead *in_stack_ffffffffffffffd8;
  Segment *this_02;
  IMkvWriter *writer;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  writer = in_RDI;
  UpdateDocTypeVersion(in_stack_ffffffffffffffd0);
  DocTypeIsWebm(in_stack_00000078);
  bVar1 = WriteEbmlHeader(in_stack_ffffffffffffffc8,(uint64_t)in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
  iVar4 = (int32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (bVar1) {
    *(undefined4 *)((long)&in_RDI[0x12d]._vptr_IMkvWriter + 4) =
         *(undefined4 *)&in_RDI[0x12d]._vptr_IMkvWriter;
    uVar2 = (**(code **)(*in_RDI[0x131]._vptr_IMkvWriter + 8))();
    *(undefined4 *)((long)&in_RDI[0x12a]._vptr_IMkvWriter + 4) = uVar2;
    iVar3 = WriteID((IMkvWriter *)in_stack_ffffffffffffffd8,(uint64)in_stack_ffffffffffffffd0);
    if (iVar3 == 0) {
      pp_Var6 = (_func_int **)(**(code **)(*in_RDI[0x131]._vptr_IMkvWriter + 8))();
      in_RDI[300]._vptr_IMkvWriter = pp_Var6;
      iVar4 = SerializeInt((IMkvWriter *)in_stack_ffffffffffffffd8,(int64)in_stack_ffffffffffffffd0,
                           iVar4);
      if (iVar4 == 0) {
        pp_Var6 = (_func_int **)(**(code **)(*in_RDI[0x131]._vptr_IMkvWriter + 8))();
        in_RDI[299]._vptr_IMkvWriter = pp_Var6;
        if ((*(int *)&in_RDI[0x129]._vptr_IMkvWriter == 2) &&
           (uVar7 = (**(code **)(*in_RDI[0x131]._vptr_IMkvWriter + 0x18))(), (uVar7 & 1) != 0)) {
          SegmentInfo::set_duration((SegmentInfo *)(in_RDI + 0xd),1.0);
          bVar1 = SeekHead::Write(in_stack_ffffffffffffffd8,(IMkvWriter *)in_stack_ffffffffffffffd0)
          ;
          if (!bVar1) {
            return false;
          }
        }
        this_02 = (Segment *)(in_RDI + 4);
        uVar8 = MaxOffset(this_02);
        bVar1 = SeekHead::AddSeekEntry((SeekHead *)this_02,0x1549a966,uVar8);
        if (bVar1) {
          bVar1 = SegmentInfo::Write((SegmentInfo *)this_02,(IMkvWriter *)in_stack_ffffffffffffffd0)
          ;
          if (bVar1) {
            this_01 = (SeekHead *)(in_RDI + 4);
            uVar8 = MaxOffset(this_02);
            bVar1 = SeekHead::AddSeekEntry(this_01,0x1654ae6b,uVar8);
            if (bVar1) {
              bVar1 = Tracks::Write((Tracks *)
                                    CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                                    writer);
              if (bVar1) {
                iVar5 = Chapters::Count((Chapters *)(in_RDI + 0x15));
                if (0 < iVar5) {
                  this_00 = (SeekHead *)(in_RDI + 4);
                  uVar8 = MaxOffset(this_02);
                  bVar1 = SeekHead::AddSeekEntry(this_00,0x1043a770,uVar8);
                  if (!bVar1) {
                    return false;
                  }
                  bVar1 = Chapters::Write((Chapters *)this_02,(IMkvWriter *)this_01);
                  if (!bVar1) {
                    return false;
                  }
                }
                iVar5 = Tags::Count((Tags *)(in_RDI + 0x17));
                if (0 < iVar5) {
                  in_stack_ffffffffffffffc0 = (SeekHead *)(in_RDI + 4);
                  uVar8 = MaxOffset(this_02);
                  bVar1 = SeekHead::AddSeekEntry(in_stack_ffffffffffffffc0,0x1254c367,uVar8);
                  if (!bVar1) {
                    return false;
                  }
                  bVar1 = Tags::Write(in_stack_00000008,unaff_retaddr);
                  if (!bVar1) {
                    return false;
                  }
                }
                if ((((ulong)in_RDI[0x1e]._vptr_IMkvWriter & 1) != 0) &&
                   ((*(int *)&in_RDI[0x129]._vptr_IMkvWriter == 1 ||
                    (uVar7 = (**(code **)(*in_RDI[0x131]._vptr_IMkvWriter + 0x18))(),
                    (uVar7 & 1) == 0)))) {
                  if (in_RDI[0x1d]._vptr_IMkvWriter == (_func_int **)0x0) {
                    return false;
                  }
                  MkvWriter::Close((MkvWriter *)in_stack_ffffffffffffffc0);
                }
                *(undefined1 *)((long)&in_RDI[0x28]._vptr_IMkvWriter + 1) = 1;
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
            }
            else {
              bVar1 = false;
            }
          }
          else {
            bVar1 = false;
          }
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Segment::WriteSegmentHeader() {
  UpdateDocTypeVersion();

  const char* const doc_type =
      DocTypeIsWebm() ? kDocTypeWebm : kDocTypeMatroska;
  if (!WriteEbmlHeader(writer_header_, doc_type_version_, doc_type))
    return false;
  doc_type_version_written_ = doc_type_version_;
  ebml_header_size_ = static_cast<int32_t>(writer_header_->Position());

  // Write "unknown" (-1) as segment size value. If mode is kFile, Segment
  // will write over duration when the file is finalized.
  if (WriteID(writer_header_, libwebm::kMkvSegment))
    return false;

  // Save for later.
  size_position_ = writer_header_->Position();

  // Write "unknown" (EBML coded -1) as segment size value. We need to write 8
  // bytes because if we are going to overwrite the segment size later we do
  // not know how big our segment will be.
  if (SerializeInt(writer_header_, kEbmlUnknownValue, 8))
    return false;

  payload_pos_ = writer_header_->Position();

  if (mode_ == kFile && writer_header_->Seekable()) {
    // Set the duration > 0.0 so SegmentInfo will write out the duration. When
    // the muxer is done writing we will set the correct duration and have
    // SegmentInfo upadte it.
    segment_info_.set_duration(1.0);

    if (!seek_head_.Write(writer_header_))
      return false;
  }

  if (!seek_head_.AddSeekEntry(libwebm::kMkvInfo, MaxOffset()))
    return false;
  if (!segment_info_.Write(writer_header_))
    return false;

  if (!seek_head_.AddSeekEntry(libwebm::kMkvTracks, MaxOffset()))
    return false;
  if (!tracks_.Write(writer_header_))
    return false;

  if (chapters_.Count() > 0) {
    if (!seek_head_.AddSeekEntry(libwebm::kMkvChapters, MaxOffset()))
      return false;
    if (!chapters_.Write(writer_header_))
      return false;
  }

  if (tags_.Count() > 0) {
    if (!seek_head_.AddSeekEntry(libwebm::kMkvTags, MaxOffset()))
      return false;
    if (!tags_.Write(writer_header_))
      return false;
  }

  if (chunking_ && (mode_ == kLive || !writer_header_->Seekable())) {
    if (!chunk_writer_header_)
      return false;

    chunk_writer_header_->Close();
  }

  header_written_ = true;

  return true;
}